

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O1

ostream * __thiscall
tchecker::parsing::event_declaration_t::output(event_declaration_t *this,ostream *os)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"event:",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(this->_name)._M_dataplus._M_p,(this->_name)._M_string_length);
  poVar1 = parsing::operator<<(poVar1,&(this->super_inner_declaration_t).super_declaration_t._attr);
  return poVar1;
}

Assistant:

std::ostream & event_declaration_t::output(std::ostream & os) const { return os << "event:" << _name << _attr; }